

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

int lyxp_set_cast(lyxp_set *set,lyxp_set_type target,lyd_node *cur_node,lys_module *param_4,
                 int options)

{
  char cVar1;
  lyxp_set_type lVar2;
  int iVar3;
  LY_ERR *pLVar4;
  lyxp_set_nodes *__return_storage_ptr__;
  undefined8 uVar5;
  lyd_node *str_00;
  char *pcVar6;
  ushort in_FPUControlWord;
  longdouble in_ST0;
  longdouble lVar7;
  long local_68;
  ushort uStack_60;
  lyxp_set_nodes *local_40;
  char *str;
  
  if (set == (lyxp_set *)0x0) {
    return 0;
  }
  lVar2 = set->type;
  str_00 = (lyd_node *)(ulong)lVar2;
  if (lVar2 == target) {
    return 0;
  }
  if ((target == LYXP_SET_NODE_SET) || (target != LYXP_SET_EMPTY && lVar2 == LYXP_SET_SNODE_SET)) {
    __assert_fail("(target != LYXP_SET_NODE_SET) && ((set->type != LYXP_SET_SNODE_SET) || (target == LYXP_SET_EMPTY))"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/xpath.c"
                  ,0x1d21,
                  "int lyxp_set_cast(struct lyxp_set *, enum lyxp_set_type, const struct lyd_node *, const struct lys_module *, int)"
                 );
  }
  if (lVar2 == LYXP_SET_SNODE_SET) {
    free((set->val).nodes);
    return -1;
  }
  if (target != LYXP_SET_BOOLEAN) {
    if (target != LYXP_SET_STRING) {
      if (target != LYXP_SET_NUMBER) {
        if (target != LYXP_SET_EMPTY) {
          return 0;
        }
        if (1 < lVar2 - LYXP_SET_BOOLEAN) {
          if ((lVar2 != LYXP_SET_NODE_SET) && (lVar2 != LYXP_SET_STRING)) {
            pLVar4 = ly_errno_location();
            *pLVar4 = LY_EINT;
            uVar5 = 0x1db0;
            goto LAB_00160c6f;
          }
          free((set->val).nodes);
        }
        set->type = LYXP_SET_EMPTY;
        return 0;
      }
      if (lVar2 < LYXP_SET_SNODE_SET) goto code_r0x00160963;
      if (lVar2 == LYXP_SET_BOOLEAN) {
        if ((set->val).bool == 0) {
          lVar7 = (longdouble)0;
        }
        else {
          lVar7 = (longdouble)1;
        }
        (set->val).num = lVar7;
        goto LAB_00160cc2;
      }
      if (lVar2 != LYXP_SET_STRING) {
        pLVar4 = ly_errno_location();
        *pLVar4 = LY_EINT;
        uVar5 = 0x1d79;
        goto LAB_00160c6f;
      }
      __return_storage_ptr__ = (set->val).nodes;
      goto LAB_00160ca5;
    }
code_r0x00160963:
    switch(lVar2) {
    case LYXP_SET_EMPTY:
      __return_storage_ptr__ = (lyxp_set_nodes *)strdup("");
      (set->val).str = (char *)__return_storage_ptr__;
      if (__return_storage_ptr__ == (lyxp_set_nodes *)0x0) {
LAB_0016098f:
        pLVar4 = ly_errno_location();
        *pLVar4 = LY_EMEM;
        ly_log(LY_LLERR,"Memory allocation failed (%s()).","lyxp_set_cast");
        return -1;
      }
      break;
    case LYXP_SET_NODE_SET:
      if (set->used == 0) {
        __assert_fail("set->used",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/xpath.c"
                      ,0x1d4b,
                      "int lyxp_set_cast(struct lyxp_set *, enum lyxp_set_type, const struct lyd_node *, const struct lys_module *, int)"
                     );
      }
      iVar3 = set_sort(set,cur_node,options);
      if (1 < iVar3) {
        pLVar4 = ly_errno_location();
        *pLVar4 = LY_EINT;
        ly_log(LY_LLERR,"XPath set was expected to be sorted, but is not (%s).","lyxp_set_cast");
      }
      __return_storage_ptr__ =
           (lyxp_set_nodes *)cast_node_set_to_string(set,cur_node,param_4,options);
      if (__return_storage_ptr__ == (lyxp_set_nodes *)0x0) {
        return -1;
      }
      local_40 = __return_storage_ptr__;
      free((set->val).nodes);
LAB_00160ad1:
      (set->val).str = (char *)__return_storage_ptr__;
      str_00 = cur_node;
      break;
    default:
      pLVar4 = ly_errno_location();
      *pLVar4 = LY_EINT;
      uVar5 = 0x1d63;
LAB_00160c6f:
      ly_log(LY_LLERR,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/xpath.c",
             uVar5);
      return -1;
    case LYXP_SET_BOOLEAN:
      if ((set->val).bool == 0) {
        pcVar6 = "false";
      }
      else {
        pcVar6 = "true";
      }
      goto LAB_00160c8c;
    case LYXP_SET_NUMBER:
      lVar7 = (set->val).num;
      if (NAN(lVar7)) {
        pcVar6 = "NaN";
      }
      else if ((lVar7 != (longdouble)0) || (NAN(lVar7) || NAN((longdouble)0))) {
        local_68 = SUB108(lVar7,0);
        uStack_60 = (ushort)((unkuint10)lVar7 >> 0x40);
        if ((short)uStack_60 < 0 || ((~uStack_60 & 0x7fff) != 0 || local_68 != -0x8000000000000000))
        {
          if (((~uStack_60 & 0x7fff) != 0 || local_68 != -0x8000000000000000) ||
              -1 < (short)uStack_60) {
            str._4_2_ = in_FPUControlWord | 0xc00;
            if ((lVar7 != (longdouble)(long)ROUND(lVar7)) ||
               (NAN(lVar7) || NAN((longdouble)(long)ROUND(lVar7)))) {
              pcVar6 = "%03.1Lf";
              iVar3 = asprintf((char **)&local_40,"%03.1Lf");
            }
            else {
              pcVar6 = "%lld";
              iVar3 = asprintf((char **)&local_40,"%lld");
            }
            __return_storage_ptr__ = local_40;
            cur_node = (lyd_node *)pcVar6;
            if (iVar3 == -1) goto LAB_0016098f;
            goto LAB_00160ad1;
          }
          pcVar6 = "-Infinity";
        }
        else {
          pcVar6 = "Infinity";
        }
      }
      else {
        pcVar6 = "0";
      }
LAB_00160c8c:
      __return_storage_ptr__ = (lyxp_set_nodes *)strdup(pcVar6);
      (set->val).str = (char *)__return_storage_ptr__;
    }
    set->type = LYXP_SET_STRING;
    if (target != LYXP_SET_NUMBER) {
      return 0;
    }
LAB_00160ca5:
    cast_string_to_number((longdouble *)__return_storage_ptr__,(char *)str_00);
    free((set->val).nodes);
    (set->val).num = in_ST0;
LAB_00160cc2:
    set->type = LYXP_SET_NUMBER;
    return 0;
  }
  switch(lVar2) {
  case LYXP_SET_NODE_SET:
    free((set->val).nodes);
    if (set->used == 0) {
      __assert_fail("set->used",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/xpath.c"
                    ,0x1d95,
                    "int lyxp_set_cast(struct lyxp_set *, enum lyxp_set_type, const struct lyd_node *, const struct lys_module *, int)"
                   );
    }
    goto LAB_00160b5d;
  default:
    pLVar4 = ly_errno_location();
    *pLVar4 = LY_EINT;
    uVar5 = 0x1d9c;
    goto LAB_00160c6f;
  case LYXP_SET_NUMBER:
    if ((longdouble)0 != (set->val).num) {
      (set->val).bool = 1;
      break;
    }
  case LYXP_SET_EMPTY:
    (set->val).bool = 0;
    break;
  case LYXP_SET_STRING:
    cVar1 = *(set->val).str;
    free((set->val).str);
    if (cVar1 == '\0') {
      (set->val).bool = 0;
      break;
    }
LAB_00160b5d:
    (set->val).bool = 1;
  }
  set->type = LYXP_SET_BOOLEAN;
  return 0;
}

Assistant:

int
lyxp_set_cast(struct lyxp_set *set, enum lyxp_set_type target, const struct lyd_node *cur_node,
              const struct lys_module *local_mod, int options)
{
    long double num;
    char *str;

    if (!set || (set->type == target)) {
        return EXIT_SUCCESS;
    }

    /* it's not possible to convert anything into a node set */
    assert((target != LYXP_SET_NODE_SET) && ((set->type != LYXP_SET_SNODE_SET) || (target == LYXP_SET_EMPTY)));

    if (set->type == LYXP_SET_SNODE_SET) {
        free(set->val.snodes);
        return -1;
    }

    /* to STRING */
    if ((target == LYXP_SET_STRING) || ((target == LYXP_SET_NUMBER)
            && ((set->type == LYXP_SET_NODE_SET) || (set->type == LYXP_SET_EMPTY)))) {
        switch (set->type) {
        case LYXP_SET_NUMBER:
            if (isnan(set->val.num)) {
                set->val.str = strdup("NaN");
            } else if ((set->val.num == 0) || (set->val.num == -0.0f)) {
                set->val.str = strdup("0");
            } else if (isinf(set->val.num) && !signbit(set->val.num)) {
                set->val.str = strdup("Infinity");
            } else if (isinf(set->val.num) && signbit(set->val.num)) {
                set->val.str = strdup("-Infinity");
            } else if ((long long)set->val.num == set->val.num) {
                if (asprintf(&str, "%lld", (long long)set->val.num) == -1) {
                    LOGMEM;
                    return -1;
                }
                set->val.str = str;
            } else {
                if (asprintf(&str, "%03.1Lf", set->val.num) == -1) {
                    LOGMEM;
                    return -1;
                }
                set->val.str = str;
            }
            break;
        case LYXP_SET_BOOLEAN:
            if (set->val.bool) {
                set->val.str = strdup("true");
            } else {
                set->val.str = strdup("false");
            }
            break;
        case LYXP_SET_NODE_SET:
            assert(set->used);

#ifndef NDEBUG
            /* we need the set sorted, it affects the result */
            if (set_sort(set, cur_node, options) > 1) {
                LOGERR(LY_EINT, "XPath set was expected to be sorted, but is not (%s).", __func__);
            }
#endif

            str = cast_node_set_to_string(set, (struct lyd_node *)cur_node, (struct lys_module *)local_mod, options);
            if (!str) {
                return -1;
            }
            free(set->val.nodes);
            set->val.str = str;
            break;
        case LYXP_SET_EMPTY:
            set->val.str = strdup("");
            if (!set->val.str) {
                LOGMEM;
                return -1;
            }
            break;
        default:
            LOGINT;
            return -1;
        }
        set->type = LYXP_SET_STRING;
    }

    /* to NUMBER */
    if (target == LYXP_SET_NUMBER) {
        switch (set->type) {
        case LYXP_SET_STRING:
            num = cast_string_to_number(set->val.str);
            free(set->val.str);
            set->val.num = num;
            break;
        case LYXP_SET_BOOLEAN:
            if (set->val.bool) {
                set->val.num = 1;
            } else {
                set->val.num = 0;
            }
            break;
        default:
            LOGINT;
            return -1;
        }
        set->type = LYXP_SET_NUMBER;
    }

    /* to BOOLEAN */
    if (target == LYXP_SET_BOOLEAN) {
        switch (set->type) {
        case LYXP_SET_NUMBER:
            if ((set->val.num == 0) || (set->val.num == -0.0f) || isnan(set->val.num)) {
                set->val.bool = 0;
            } else {
                set->val.bool = 1;
            }
            break;
        case LYXP_SET_STRING:
            if (set->val.str[0]) {
                free(set->val.str);
                set->val.bool = 1;
            } else {
                free(set->val.str);
                set->val.bool = 0;
            }
            break;
        case LYXP_SET_NODE_SET:
            free(set->val.nodes);

            assert(set->used);
            set->val.bool = 1;
            break;
        case LYXP_SET_EMPTY:
            set->val.bool = 0;
            break;
        default:
            LOGINT;
            return -1;
        }
        set->type = LYXP_SET_BOOLEAN;
    }

    /* to EMPTY */
    if (target == LYXP_SET_EMPTY) {
        switch (set->type) {
        case LYXP_SET_NUMBER:
        case LYXP_SET_BOOLEAN:
            /* nothing to do */
            break;
        case LYXP_SET_STRING:
            free(set->val.str);
            break;
        case LYXP_SET_NODE_SET:
            free(set->val.nodes);
            break;
        default:
            LOGINT;
            return -1;
        }
        set->type = LYXP_SET_EMPTY;
    }

    return EXIT_SUCCESS;
}